

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

char * detect_proxy(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  int iVar2;
  char *local_c0;
  char *prox;
  char *envp;
  char *protop;
  char proxy_env [128];
  char *local_20;
  char *proxy;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  prox = (char *)&protop;
  envp = conn->handler->scheme;
  while (*envp != '\0') {
    cVar1 = Curl_raw_tolower(*envp);
    *prox = cVar1;
    prox = prox + 1;
    envp = envp + 1;
  }
  strcpy(prox,"_proxy");
  local_c0 = curl_getenv((char *)&protop);
  if ((local_c0 == (char *)0x0) &&
     (iVar2 = Curl_strcasecompare("http_proxy",(char *)&protop), iVar2 == 0)) {
    Curl_strntoupper((char *)&protop,(char *)&protop,0x80);
    local_c0 = curl_getenv((char *)&protop);
  }
  prox = (char *)&protop;
  if (local_c0 == (char *)0x0) {
    prox = "all_proxy";
    local_20 = curl_getenv("all_proxy");
    if (local_20 == (char *)0x0) {
      prox = "ALL_PROXY";
      local_20 = curl_getenv("ALL_PROXY");
    }
  }
  else {
    local_20 = local_c0;
  }
  if (local_20 != (char *)0x0) {
    Curl_infof(data,"Uses proxy env variable %s == \'%s\'",prox,local_20);
  }
  return local_20;
}

Assistant:

static char *detect_proxy(struct Curl_easy *data,
                          struct connectdata *conn)
{
  char *proxy = NULL;

  /* If proxy was not specified, we check for default proxy environment
   * variables, to enable i.e Lynx compliance:
   *
   * http_proxy=http://some.server.dom:port/
   * https_proxy=http://some.server.dom:port/
   * ftp_proxy=http://some.server.dom:port/
   * no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   * all_proxy=http://some.server.dom:port/
   *   (seems to exist for the CERN www lib. Probably
   *   the first to check for.)
   *
   * For compatibility, the all-uppercase versions of these variables are
   * checked if the lowercase versions don't exist.
   */
  char proxy_env[128];
  const char *protop = conn->handler->scheme;
  char *envp = proxy_env;
  char *prox;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* Now, build <protocol>_proxy and check for such a one to use */
  while(*protop)
    *envp++ = Curl_raw_tolower(*protop++);

  /* append _proxy */
  strcpy(envp, "_proxy");

  /* read the protocol proxy: */
  prox = curl_getenv(proxy_env);

  /*
   * We don't try the uppercase version of HTTP_PROXY because of
   * security reasons:
   *
   * When curl is used in a webserver application
   * environment (cgi or php), this environment variable can
   * be controlled by the web server user by setting the
   * http header 'Proxy:' to some value.
   *
   * This can cause 'internal' http/ftp requests to be
   * arbitrarily redirected by any external attacker.
   */
  if(!prox && !strcasecompare("http_proxy", proxy_env)) {
    /* There was no lowercase variable, try the uppercase version: */
    Curl_strntoupper(proxy_env, proxy_env, sizeof(proxy_env));
    prox = curl_getenv(proxy_env);
  }

  envp = proxy_env;
  if(prox) {
    proxy = prox; /* use this */
  }
  else {
    envp = (char *)"all_proxy";
    proxy = curl_getenv(envp); /* default proxy to use */
    if(!proxy) {
      envp = (char *)"ALL_PROXY";
      proxy = curl_getenv(envp);
    }
  }
  if(proxy)
    infof(data, "Uses proxy env variable %s == '%s'", envp, proxy);

  return proxy;
}